

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

qint64 __thiscall QSslSocketPrivate::peek(QSslSocketPrivate *this,char *data,qint64 maxSize)

{
  qint64 qVar1;
  long lVar2;
  long lVar3;
  
  if ((this->mode == UnencryptedMode) && (this->autoStartHandshake == false)) {
    qVar1 = QIODevicePrivate::QRingBufferRef::peek
                      ((QRingBufferRef *)
                       &(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x90,data
                       ,maxSize,*(qint64 *)
                                 &(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.
                                  field_0x88);
    if (maxSize != qVar1) {
      if (this->plainSocket == (QTcpSocket *)0x0) {
        maxSize = -1;
      }
      else {
        lVar2 = QIODevice::peek((char *)this->plainSocket,(longlong)(data + qVar1));
        lVar3 = lVar2;
        if (0 < qVar1) {
          lVar3 = qVar1;
        }
        maxSize = qVar1 + lVar2;
        if (lVar2 < 0) {
          maxSize = lVar3;
        }
      }
    }
    return maxSize;
  }
  qVar1 = QIODevicePrivate::peek((char *)this,(longlong)data);
  return qVar1;
}

Assistant:

qint64 QSslSocketPrivate::peek(char *data, qint64 maxSize)
{
    if (mode == QSslSocket::UnencryptedMode && !autoStartHandshake) {
        //unencrypted mode - do not use QIODevice::peek, as it reads ahead data from the plain socket
        //peek at data already in the QIODevice buffer (from a previous read)
        qint64 r = buffer.peek(data, maxSize, transactionPos);
        if (r == maxSize)
            return r;
        data += r;
        //peek at data in the plain socket
        if (plainSocket) {
            qint64 r2 = plainSocket->peek(data, maxSize - r);
            if (r2 < 0)
                return (r > 0 ? r : r2);
            return r + r2;
        }

        return -1;
    } else {
        //encrypted mode - the socket engine will read and decrypt data into the QIODevice buffer
        return QTcpSocketPrivate::peek(data, maxSize);
    }
}